

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_3dcb0::commit_to_party_seed
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          limbo_instance_t *instance,vector<unsigned_char,_std::allocator<unsigned_char>_> *seed,
          limbo_salt_t *salt,size_t rep_idx,size_t party_idx)

{
  BitSequence *pBVar1;
  HashReturn HVar2;
  undefined4 extraout_var;
  uint capacity;
  uint rate;
  uint16_t data_le;
  hash_context ctx;
  undefined2 local_152;
  size_t local_150;
  limbo_instance_t *local_148;
  Keccak_HashInstance local_140;
  
  if (instance->digest_size == 0x20) {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  local_150 = party_idx;
  local_148 = instance;
  Keccak_HashInitialize(&local_140,rate,capacity,0,'\x1f');
  Keccak_HashUpdate(&local_140,salt->_M_elems,0x100);
  local_152 = (undefined2)rep_idx;
  Keccak_HashUpdate(&local_140,(BitSequence *)&local_152,0x10);
  local_152 = (undefined2)local_150;
  Keccak_HashUpdate(&local_140,(BitSequence *)&local_152,0x10);
  pBVar1 = (seed->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Keccak_HashUpdate(&local_140,pBVar1,
                    ((long)(seed->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) * 8);
  Keccak_HashFinal(&local_140,(BitSequence *)0x0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(ulong)local_148->digest_size,(allocator_type *)&local_152);
  pBVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  HVar2 = Keccak_HashSqueeze(&local_140,pBVar1,
                             ((long)(__return_storage_ptr__->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) * 8)
  ;
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(extraout_var,HVar2);
}

Assistant:

std::vector<uint8_t> commit_to_party_seed(const limbo_instance_t &instance,
                                          const std::vector<uint8_t> &seed,
                                          const limbo_salt_t &salt,
                                          size_t rep_idx, size_t party_idx) {
  hash_context ctx;
  hash_init(&ctx, instance.digest_size);
  hash_update(&ctx, salt.data(), salt.size());
  hash_update_uint16_le(&ctx, (uint16_t)rep_idx);
  hash_update_uint16_le(&ctx, (uint16_t)party_idx);
  hash_update(&ctx, seed.data(), seed.size());
  hash_final(&ctx);

  std::vector<uint8_t> commitment(instance.digest_size);
  hash_squeeze(&ctx, commitment.data(), commitment.size());
  return commitment;
}